

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall Units_unitAttributes_Test::TestBody(Units_unitAttributes_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertHelper local_4a0 [8];
  Message local_498 [8];
  undefined1 local_490 [8];
  AssertionResult gtest_ar_18;
  Message local_478 [8];
  undefined1 local_470 [8];
  AssertionResult gtest_ar_17;
  Message local_458 [8];
  undefined1 local_450 [8];
  AssertionResult gtest_ar_16;
  string local_438 [32];
  AssertHelper local_418 [8];
  Message local_410 [8];
  undefined1 local_408 [8];
  AssertionResult gtest_ar_15;
  Message local_3f0 [8];
  undefined1 local_3e8 [8];
  AssertionResult gtest_ar_14;
  string local_3d0 [32];
  AssertHelper local_3b0 [8];
  Message local_3a8 [8];
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_13;
  Message local_388 [8];
  undefined1 local_380 [8];
  AssertionResult gtest_ar_12;
  string local_368 [39];
  allocator<char> local_341;
  string local_340 [39];
  allocator<char> local_319;
  string local_318 [32];
  AssertHelper local_2f8 [8];
  Message local_2f0 [8];
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  Message local_2d0 [8];
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_10;
  Message local_2b0 [8];
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_9;
  Message local_290 [8];
  undefined1 local_288 [8];
  AssertionResult gtest_ar_8;
  Message local_270 [8];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_7;
  Message local_250 [8];
  undefined1 local_248 [8];
  AssertionResult gtest_ar_6;
  Message local_230 [8];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_5;
  Message local_210 [8];
  undefined1 local_208 [8];
  AssertionResult gtest_ar_4;
  string local_1f0 [39];
  allocator<char> local_1c9;
  string local_1c8 [32];
  AssertHelper local_1a8 [8];
  Message local_1a0 [8];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_3;
  Message local_180 [8];
  undefined1 local_178 [8];
  AssertionResult gtest_ar_2;
  Message local_160 [8];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  Message local_140 [8];
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  double multiplier;
  double exponent;
  string id;
  string prefix;
  string reference;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  UnitsPtr u;
  ModelPtr m;
  Units_unitAttributes_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Units::create();
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"fahrenheitish",&local_51);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"kelvin",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b0,"",(allocator<char> *)(reference.field_2._M_local_buf + 0xf));
  libcellml::Units::addUnit((string *)peVar2,(int)local_88,1.0,1.8,(string *)0x0);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)(reference.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  libcellml::Model::addUnits((shared_ptr *)peVar3);
  std::__cxx11::string::string((string *)(prefix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(id.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&exponent);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::Units::unitAttributes
            ((ulong)peVar2,(string *)0x0,(string *)(prefix.field_2._M_local_buf + 8),
             (double *)(id.field_2._M_local_buf + 8),&multiplier,(string *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[7],std::__cxx11::string>
            ((EqHelper<false> *)local_138,"\"kelvin\"","reference",(char (*) [7])"kelvin",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(local_140);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2ef,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_158,"\"\"","prefix",(char (*) [1])0x18cba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&id.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(local_160);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_178,"1.0","exponent",1.0,multiplier);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f1,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_198,"1.8","multiplier",1.8,(double)gtest_ar.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(local_1a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              (local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f2,pcVar4);
    testing::internal::AssertHelper::operator=(local_1a8,local_1a0);
    testing::internal::AssertHelper::~AssertHelper(local_1a8);
    testing::Message::~Message(local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,"NewUnit",&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,"",(allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar2,(int)local_1c8,1.05,17.0,(string *)0x4);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::Units::unitAttributes
            ((ulong)peVar2,(string *)0x1,(string *)(prefix.field_2._M_local_buf + 8),
             (double *)((long)&id.field_2 + 8),&multiplier,(string *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[8],std::__cxx11::string>
            ((EqHelper<false> *)local_208,"\"NewUnit\"","reference",(char (*) [8])"NewUnit",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(local_210);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  testing::internal::EqHelper<false>::Compare<char[2],std::__cxx11::string>
            ((EqHelper<false> *)local_228,"\"4\"","prefix",(char (*) [2])0x18cbc9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&id.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar1) {
    testing::Message::Message(local_230);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_248,"1.05","exponent",1.05,multiplier);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(local_250);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_268,"17","multiplier",17.0,(double)gtest_ar.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(local_270);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2f9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_270);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::Units::unitAttributes
            ((ulong)peVar2,(string *)0x2,(string *)(prefix.field_2._M_local_buf + 8),
             (double *)((long)&id.field_2 + 8),&multiplier,(string *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_288,"\"\"","reference",(char (*) [1])0x18cba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_288);
  if (!bVar1) {
    testing::Message::Message(local_290);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2fd,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_288);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_2a8,"\"\"","prefix",(char (*) [1])0x18cba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&id.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2fe,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2c8,"1","exponent",1.0,multiplier);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(local_2d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x2ff,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_2e8,"1","multiplier",1.0,(double)gtest_ar.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(local_2f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              (local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x300,pcVar4);
    testing::internal::AssertHelper::operator=(local_2f8,local_2f0);
    testing::internal::AssertHelper::~AssertHelper(local_2f8);
    testing::Message::~Message(local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"daves",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"house",&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_368,"",(allocator<char> *)((long)&gtest_ar_12.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar2,local_318,1.0,1.0,local_340);
  std::__cxx11::string::~string(local_368);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_12.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator(&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator(&local_319);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  libcellml::Units::unitAttributes
            ((ulong)peVar2,(string *)0x2,(string *)(prefix.field_2._M_local_buf + 8),
             (double *)((long)&id.field_2 + 8),&multiplier,(string *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_380,"\"daves\"","reference",(char (*) [6])"daves",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(local_388);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x304,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_3a0,"\"house\"","prefix",(char (*) [6])"house",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&id.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(local_3a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x305,pcVar4);
    testing::internal::AssertHelper::operator=(local_3b0,local_3a8);
    testing::internal::AssertHelper::~AssertHelper(local_3b0);
    testing::Message::~Message(local_3a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3d0,"daves",(allocator<char> *)((long)&gtest_ar_14.message_.ptr_ + 7));
  libcellml::Units::unitAttributes
            ((string *)peVar2,local_3d0,(double *)((long)&id.field_2 + 8),&multiplier,
             (string *)&gtest_ar.message_);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_14.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_3e8,"\"daves\"","reference",(char (*) [6])"daves",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&prefix.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e8);
  if (!bVar1) {
    testing::Message::Message(local_3f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x308,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((EqHelper<false> *)local_408,"\"house\"","prefix",(char (*) [6])"house",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&id.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(local_410);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              (local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x309,pcVar4);
    testing::internal::AssertHelper::operator=(local_418,local_410);
    testing::internal::AssertHelper::~AssertHelper(local_418);
    testing::Message::~Message(local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  peVar2 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_438,"kelvin",(allocator<char> *)((long)&gtest_ar_16.message_.ptr_ + 7));
  libcellml::Units::unitAttributes
            ((string *)peVar2,local_438,(double *)((long)&id.field_2 + 8),&multiplier,
             (string *)&gtest_ar.message_);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_16.message_.ptr_ + 7));
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_450,"\"\"","prefix",(char (*) [1])0x18cba0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&id.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_450);
  if (!bVar1) {
    testing::Message::Message(local_458);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_450);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_458);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_458);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_450);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_470,"1.0","exponent",1.0,multiplier);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar1) {
    testing::Message::Message(local_478);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_470);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_490,"1.8","multiplier",1.8,(double)gtest_ar.message_.ptr_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(local_498);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              (local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x30e,pcVar4);
    testing::internal::AssertHelper::operator=(local_4a0,local_498);
    testing::internal::AssertHelper::~AssertHelper(local_4a0);
    testing::Message::~Message(local_498);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  std::__cxx11::string::~string((string *)&exponent);
  std::__cxx11::string::~string((string *)(id.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prefix.field_2._M_local_buf + 8));
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Units, unitAttributes)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("fahrenheitish");

    /* Give prefix and exponent their default values. */
    u->addUnit("kelvin", 0, 1.0, 1.8);
    m->addUnits(u);

    std::string reference;
    std::string prefix;
    std::string id;
    double exponent;
    double multiplier;
    u->unitAttributes(0, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("kelvin", reference);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1.0, exponent);
    EXPECT_DOUBLE_EQ(1.8, multiplier);

    u->addUnit("NewUnit", 4, 1.05, 17.0);
    u->unitAttributes(1, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("NewUnit", reference);
    EXPECT_EQ("4", prefix);
    EXPECT_DOUBLE_EQ(1.05, exponent);
    EXPECT_DOUBLE_EQ(17, multiplier);

    // Get non-existent unit.
    u->unitAttributes(2, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("", reference);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1, exponent);
    EXPECT_DOUBLE_EQ(1, multiplier);

    u->addUnit("daves", "house");
    u->unitAttributes(2, reference, prefix, exponent, multiplier, id);
    EXPECT_EQ("daves", reference);
    EXPECT_EQ("house", prefix);

    u->unitAttributes("daves", prefix, exponent, multiplier, id);
    EXPECT_EQ("daves", reference);
    EXPECT_EQ("house", prefix);

    u->unitAttributes("kelvin", prefix, exponent, multiplier, id);
    EXPECT_EQ("", prefix);
    EXPECT_DOUBLE_EQ(1.0, exponent);
    EXPECT_DOUBLE_EQ(1.8, multiplier);
}